

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  ushort **ppuVar2;
  int local_12c;
  state *local_128;
  rule *rp;
  lemon lem;
  int i;
  char **argv_local;
  int argc_local;
  
  OptInit(argv,main::options,(FILE *)_stderr);
  if (main::version != 0) {
    printf("Lemon version 1.0\n");
    exit(0);
  }
  iVar1 = OptNArgs();
  if (iVar1 != 1) {
    fprintf(_stderr,"Exactly one filename argument is required.\n");
    exit(1);
  }
  memset(&rp,0,0x100);
  lem.symbols._0_4_ = 0;
  Strsafe_init();
  Symbol_init();
  State_init();
  lem._240_8_ = *argv;
  lem.vardest = OptArg(0);
  lem.filename = stitch_outdir(lem.vardest);
  lem.nactiontab = main::basisflag;
  lem.basisflag = main::nolinenosflag;
  Symbol_new("$");
  lem.wildcard = Symbol_new("error");
  (lem.wildcard)->useCnt = 0;
  Parse((lemon *)&rp);
  if ((int)lem.symbols != 0) {
    exit((int)lem.symbols);
  }
  if (lem.nstate != 0) {
    Symbol_new("{default}");
    lem.nxstate = Symbol_count();
    lem._40_8_ = Symbol_arrayof();
    for (lem.argv0._4_4_ = 0; lem.argv0._4_4_ < lem.nxstate; lem.argv0._4_4_ = lem.argv0._4_4_ + 1)
    {
      (*(symbol **)(lem._40_8_ + (long)lem.argv0._4_4_ * 8))->index = lem.argv0._4_4_;
    }
    qsort((void *)lem._40_8_,(long)lem.nxstate,8,Symbolcmpp);
    for (lem.argv0._4_4_ = 0; lem.argv0._4_4_ < lem.nxstate; lem.argv0._4_4_ = lem.argv0._4_4_ + 1)
    {
      *(int *)(*(long *)(lem._40_8_ + (long)lem.argv0._4_4_ * 8) + 8) = lem.argv0._4_4_;
    }
    while (*(int *)(*(long *)(lem._40_8_ + (long)(lem.argv0._4_4_ + -1) * 8) + 0xc) == 2) {
      lem.argv0._4_4_ = lem.argv0._4_4_ + -1;
    }
    iVar1 = strcmp((char *)**(undefined8 **)(lem._40_8_ + (long)(lem.argv0._4_4_ + -1) * 8),
                   "{default}");
    if (iVar1 != 0) {
      __assert_fail("strcmp(lem.symbols[i-1]->name,\"{default}\")==0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/tools/lemon/lemon.c"
                    ,0x661,"int main(int, char **)");
    }
    lem.nxstate = lem.argv0._4_4_ + -1;
    lem.argv0._4_4_ = 1;
    while (ppuVar2 = __ctype_b_loc(),
          ((*ppuVar2)[(int)(uint)*(byte *)**(undefined8 **)(lem._40_8_ + (long)lem.argv0._4_4_ * 8)]
          & 0x100) != 0) {
      lem.argv0._4_4_ = lem.argv0._4_4_ + 1;
    }
    lem.nrule = lem.argv0._4_4_;
    lem.argv0._4_4_ = 0;
    for (local_128 = (state *)lem.sorted; local_128 != (state *)0x0;
        local_128 = *(state **)((long)(local_128 + 1) + 0x30)) {
      if ((state *)local_128->pDfltReduce == (state *)0x0) {
        local_12c = -1;
      }
      else {
        local_12c = lem.argv0._4_4_;
        lem.argv0._4_4_ = lem.argv0._4_4_ + 1;
      }
      *(int *)((long)(local_128 + 1) + 0x1c) = local_12c;
    }
    for (local_128 = (state *)lem.sorted; local_128 != (state *)0x0;
        local_128 = *(state **)((long)(local_128 + 1) + 0x30)) {
      if (*(int *)((long)(local_128 + 1) + 0x1c) < 0) {
        *(int *)((long)(local_128 + 1) + 0x1c) = lem.argv0._4_4_;
        lem.argv0._4_4_ = lem.argv0._4_4_ + 1;
      }
    }
    lem.rule = (rule *)lem.sorted;
    lem.sorted = (state **)Rule_sort((rule *)lem.sorted);
    if (main::rpflag == 0) {
      SetSize(lem.nrule + 1);
      FindRulePrecedences((lemon *)&rp);
      FindFirstSets((lemon *)&rp);
      lem.startRule._0_4_ = 0;
      FindStates((lemon *)&rp);
      rp = (rule *)State_arrayof();
      FindLinks((lemon *)&rp);
      FindFollowSets((lemon *)&rp);
      FindActions((lemon *)&rp);
      if (main::compress == 0) {
        CompressTables((lemon *)&rp);
      }
      if (main::noResort == 0) {
        ResortStates((lemon *)&rp);
      }
      if (main::quiet == 0) {
        ReportOutput((lemon *)&rp);
      }
      ReportTable((lemon *)&rp,main::mhflag);
      if (main::mhflag == 0) {
        ReportHeader((lemon *)&rp);
      }
    }
    else {
      Reprint((lemon *)&rp);
    }
    if (main::statistics != 0) {
      printf("Parser statistics:\n");
      stats_line("terminal symbols",lem.nrule);
      stats_line("non-terminal symbols",lem.nxstate - lem.nrule);
      stats_line("total symbols",lem.nxstate);
      stats_line("rules",lem.nstate);
      stats_line("states",lem.startRule._4_4_);
      stats_line("conflicts",(uint)lem.tokenprefix);
      stats_line("action table entries",lem.tokenprefix._4_4_);
      stats_line("total table size (bytes)",lem.nconflict);
    }
    if ((uint)lem.tokenprefix != 0) {
      fprintf(_stderr,"%d parsing conflicts.\n",(ulong)(uint)lem.tokenprefix);
    }
    exit((int)lem.symbols + (uint)lem.tokenprefix);
  }
  fprintf(_stderr,"Empty grammar.\n");
  exit(1);
}

Assistant:

int main(int argc, char **argv)
{
  static int version = 0;
  static int rpflag = 0;
  static int basisflag = 0;
  static int compress = 0;
  static int quiet = 0;
  static int statistics = 0;
  static int mhflag = 0;
  static int nolinenosflag = 0;
  static int noResort = 0;
  static struct s_options options[] = {
    {OPT_FLAG, "b", (char*)&basisflag, "Print only the basis in report."},
    {OPT_FLAG, "c", (char*)&compress, "Don't compress the action table."},
    {OPT_FSTR, "C", (char*)handle_C_option, "Write output files to a different directory."},
    {OPT_FSTR, "D", (char*)handle_D_option, "Define an %ifdef macro."},
    {OPT_FSTR, "f", 0, "Ignored.  (Placeholder for -f compiler options.)"},
    {OPT_FLAG, "g", (char*)&rpflag, "Print grammar without actions."},
    {OPT_FSTR, "I", 0, "Ignored.  (Placeholder for '-I' compiler options.)"},
    {OPT_FLAG, "m", (char*)&mhflag, "Output a makeheaders compatible file."},
    {OPT_FLAG, "l", (char*)&nolinenosflag, "Do not print #line statements."},
    {OPT_FSTR, "O", 0, "Ignored.  (Placeholder for '-O' compiler options.)"},
    {OPT_FLAG, "p", (char*)&showPrecedenceConflict,
                    "Show conflicts resolved by precedence rules"},
    {OPT_FLAG, "q", (char*)&quiet, "(Quiet) Don't print the report file."},
    {OPT_FLAG, "r", (char*)&noResort, "Do not sort or renumber states"},
    {OPT_FLAG, "s", (char*)&statistics,
                                   "Print parser stats to standard output."},
    {OPT_FLAG, "x", (char*)&version, "Print the version number."},
    {OPT_FSTR, "T", (char*)handle_T_option, "Specify a template file."},
    {OPT_FSTR, "W", 0, "Ignored.  (Placeholder for '-W' compiler options.)"},
    {OPT_FLAG,0,0,0}
  };
  int i;
  struct lemon lem;
  struct rule *rp;

  OptInit(argv,options,stderr);
  if( version ){
     printf("Lemon version 1.0\n");
     exit(0); 
  }
  if( OptNArgs()!=1 ){
    fprintf(stderr,"Exactly one filename argument is required.\n");
    exit(1);
  }
  memset(&lem, 0, sizeof(lem));
  lem.errorcnt = 0;

  /* Initialize the machine */
  Strsafe_init();
  Symbol_init();
  State_init();
  lem.argv0 = argv[0];
  lem.filename = OptArg(0);
  lem.outbasefilename = stitch_outdir(lem.filename);
  lem.basisflag = basisflag;
  lem.nolinenosflag = nolinenosflag;
  Symbol_new("$");
  lem.errsym = Symbol_new("error");
  lem.errsym->useCnt = 0;

  /* Parse the input file */
  Parse(&lem);
  if( lem.errorcnt ) exit(lem.errorcnt);
  if( lem.nrule==0 ){
    fprintf(stderr,"Empty grammar.\n");
    exit(1);
  }

  /* Count and index the symbols of the grammar */
  Symbol_new("{default}");
  lem.nsymbol = Symbol_count();
  lem.symbols = Symbol_arrayof();
  for(i=0; i<lem.nsymbol; i++) lem.symbols[i]->index = i;
  qsort(lem.symbols,lem.nsymbol,sizeof(struct symbol*), Symbolcmpp);
  for(i=0; i<lem.nsymbol; i++) lem.symbols[i]->index = i;
  while( lem.symbols[i-1]->type==MULTITERMINAL ){ i--; }
  assert( strcmp(lem.symbols[i-1]->name,"{default}")==0 );
  lem.nsymbol = i - 1;
  for(i=1; ISUPPER(lem.symbols[i]->name[0]); i++);
  lem.nterminal = i;

  /* Assign sequential rule numbers.  Start with 0.  Put rules that have no
  ** reduce action C-code associated with them last, so that the switch()
  ** statement that selects reduction actions will have a smaller jump table.
  */
  for(i=0, rp=lem.rule; rp; rp=rp->next){
    rp->iRule = rp->code ? i++ : -1;
  }
  for(rp=lem.rule; rp; rp=rp->next){
    if( rp->iRule<0 ) rp->iRule = i++;
  }
  lem.startRule = lem.rule;
  lem.rule = Rule_sort(lem.rule);

  /* Generate a reprint of the grammar, if requested on the command line */
  if( rpflag ){
    Reprint(&lem);
  }else{
    /* Initialize the size for all follow and first sets */
    SetSize(lem.nterminal+1);

    /* Find the precedence for every production rule (that has one) */
    FindRulePrecedences(&lem);

    /* Compute the lambda-nonterminals and the first-sets for every
    ** nonterminal */
    FindFirstSets(&lem);

    /* Compute all LR(0) states.  Also record follow-set propagation
    ** links so that the follow-set can be computed later */
    lem.nstate = 0;
    FindStates(&lem);
    lem.sorted = State_arrayof();

    /* Tie up loose ends on the propagation links */
    FindLinks(&lem);

    /* Compute the follow set of every reducible configuration */
    FindFollowSets(&lem);

    /* Compute the action tables */
    FindActions(&lem);

    /* Compress the action tables */
    if( compress==0 ) CompressTables(&lem);

    /* Reorder and renumber the states so that states with fewer choices
    ** occur at the end.  This is an optimization that helps make the
    ** generated parser tables smaller. */
    if( noResort==0 ) ResortStates(&lem);

    /* Generate a report of the parser generated.  (the "y.output" file) */
    if( !quiet ) ReportOutput(&lem);

    /* Generate the source code for the parser */
    ReportTable(&lem, mhflag);

    /* Produce a header file for use by the scanner.  (This step is
    ** omitted if the "-m" option is used because makeheaders will
    ** generate the file for us.) */
    if( !mhflag ) ReportHeader(&lem);
  }
  if( statistics ){
    printf("Parser statistics:\n");
    stats_line("terminal symbols", lem.nterminal);
    stats_line("non-terminal symbols", lem.nsymbol - lem.nterminal);
    stats_line("total symbols", lem.nsymbol);
    stats_line("rules", lem.nrule);
    stats_line("states", lem.nxstate);
    stats_line("conflicts", lem.nconflict);
    stats_line("action table entries", lem.nactiontab);
    stats_line("total table size (bytes)", lem.tablesize);
  }
  if( lem.nconflict ){
    fprintf(stderr,"%d parsing conflicts.\n",lem.nconflict);
  }
  exit(lem.errorcnt + lem.nconflict);
  return (lem.errorcnt + lem.nconflict);
}